

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O1

void EOPLL_calcStereo(EOPLL *opll,int32_t *out)

{
  int32_t **ppiVar1;
  int32_t *piVar2;
  int32_t iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = opll->out_step;
  dVar5 = opll->out_time;
  while (dVar5 < dVar6) {
    opll->out_time = dVar5 + opll->inp_step;
    update_output(opll);
    opll->mix_out[0] = 0;
    opll->mix_out[1] = 0;
    lVar4 = -0xe;
    do {
      if ((opll->pan[lVar4 + 0xe] & 2) != 0) {
        opll->mix_out[0] =
             opll->mix_out[0] +
             ((int)*(short *)((long)opll->mix_out + lVar4 * 2) * opll->pan_fine[lVar4 + 0xe][0] >>
             0x10);
      }
      if ((opll->pan[lVar4 + 0xe] & 1) != 0) {
        opll->mix_out[1] =
             opll->mix_out[1] +
             ((int)*(short *)((long)opll->mix_out + lVar4 * 2) * opll->pan_fine[lVar4 + 0xe][1] >>
             0x10);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0);
    if (opll->conv != (EOPLL_RateConv *)0x0) {
      iVar3 = opll->mix_out[0];
      ppiVar1 = opll->conv->buf;
      piVar2 = *ppiVar1;
      memmove(piVar2,piVar2 + 1,0x3c);
      piVar2[0xf] = iVar3;
      iVar3 = opll->mix_out[1];
      piVar2 = ppiVar1[1];
      memmove(piVar2,piVar2 + 1,0x3c);
      piVar2[0xf] = iVar3;
    }
    dVar6 = opll->out_step;
    dVar5 = opll->out_time;
  }
  opll->out_time = dVar5 - dVar6;
  if (opll->conv == (EOPLL_RateConv *)0x0) {
    *out = opll->mix_out[0];
    iVar3 = opll->mix_out[1];
  }
  else {
    iVar3 = EOPLL_RateConv_getData(opll->conv,0);
    *out = iVar3;
    iVar3 = EOPLL_RateConv_getData(opll->conv,1);
  }
  out[1] = iVar3;
  return;
}

Assistant:

void EOPLL_calcStereo(EOPLL *opll, int32_t out[2]) {
  while (opll->out_step > opll->out_time) {
    opll->out_time += opll->inp_step;
    update_output(opll);
    mix_output_stereo(opll);
  }
  opll->out_time -= opll->out_step;
  if (opll->conv) {
    out[0] = EOPLL_RateConv_getData(opll->conv, 0);
    out[1] = EOPLL_RateConv_getData(opll->conv, 1);
  } else {
    out[0] = opll->mix_out[0];
    out[1] = opll->mix_out[1];
  }
}